

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall
Interpreter::Interpreter
          (Interpreter *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *lexed_data)

{
  PrintCommand *pPVar1;
  SleepCommand *pSVar2;
  OpenDataServerCommand *pOVar3;
  ConnectCommand *this_00;
  AssignVarCommand *this_01;
  DefineVarCommand *pDVar4;
  long lVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_90;
  simulatorCommand local_68 [11];
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3a;
  allocator_type local_39 [9];
  
  *(undefined8 *)((long)&this->while_command + 2) = 0;
  *(undefined8 *)((long)&this->if_command + 2) = 0;
  this->define_var_command = (DefineVarCommand *)0x0;
  this->while_command = (WhileCommand *)0x0;
  this->connect_command = (ConnectCommand *)0x0;
  this->assign_var_command = (AssignVarCommand *)0x0;
  this->sleep_command = (SleepCommand *)0x0;
  this->open_data_server_command = (OpenDataServerCommand *)0x0;
  (this->lexed_data_to_interpret).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->print_command = (PrintCommand *)0x0;
  (this->lexed_data_to_interpret).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lexed_data_to_interpret).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->condition_string)._M_dataplus._M_p = (pointer)&(this->condition_string).field_2;
  (this->condition_string)._M_string_length = 0;
  (this->condition_string).field_2._M_local_buf[0] = '\0';
  (this->condition_vector_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->condition_vector_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->condition_vector_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->while_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->while_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->while_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->if_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->if_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->if_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68[0] = OPEN_DATA_SERVER;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[15],_Interpreter::simulatorCommand,_true>
            (&local_1a8,(char (*) [15])"openDataServer",local_68);
  local_68[1] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[21],_Interpreter::simulatorCommand,_true>
            (&local_180,(char (*) [21])"connectControlClient",local_68 + 1);
  local_68[2] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[4],_Interpreter::simulatorCommand,_true>
            (&local_158,(char (*) [4])"var",local_68 + 2);
  local_68[3] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[6],_Interpreter::simulatorCommand,_true>
            (&local_130,(char (*) [6])"Print",local_68 + 3);
  local_68[4] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[6],_Interpreter::simulatorCommand,_true>
            (&local_108,(char (*) [6])"Sleep",local_68 + 4);
  local_68[5] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[6],_Interpreter::simulatorCommand,_true>
            (&local_e0,(char (*) [6])"while",local_68 + 5);
  local_68[6] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[3],_Interpreter::simulatorCommand,_true>
            (&local_b8,(char (*) [3])"if",local_68 + 6);
  local_68[7] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[2],_Interpreter::simulatorCommand,_true>
            (&local_90,(char (*) [2])"}",local_68 + 7);
  __l._M_len = 8;
  __l._M_array = &local_1a8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
  ::map(&this->CMD_DICTIONARY,__l,&local_3a,local_39);
  lVar5 = 0x118;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1a8.first._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x28);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=(&this->lexed_data_to_interpret,lexed_data);
  pPVar1 = (PrintCommand *)operator_new(0x28);
  (pPVar1->message)._M_string_length = 0;
  (pPVar1->message).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pPVar1->message).field_2 + 8) = 0;
  (pPVar1->super_Command)._vptr_Command = (_func_int **)&PTR_execute_00114880;
  (pPVar1->message)._M_dataplus._M_p = (pointer)&(pPVar1->message).field_2;
  (pPVar1->message).field_2._M_local_buf[0] = '\0';
  this->print_command = pPVar1;
  pSVar2 = (SleepCommand *)operator_new(0x30);
  (pSVar2->time_to_sleep_string)._M_string_length = 0;
  (pSVar2->time_to_sleep_string).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pSVar2->time_to_sleep_string).field_2 + 8) = 0;
  *(undefined8 *)&pSVar2->milliseconds = 0;
  (pSVar2->super_Command)._vptr_Command = (_func_int **)&PTR_execute_001148c8;
  (pSVar2->time_to_sleep_string)._M_dataplus._M_p = (pointer)&(pSVar2->time_to_sleep_string).field_2
  ;
  (pSVar2->time_to_sleep_string).field_2._M_local_buf[0] = '\0';
  this->sleep_command = pSVar2;
  pOVar3 = (OpenDataServerCommand *)operator_new(0x40);
  (pOVar3->super_Command)._vptr_Command = (_func_int **)0x0;
  *(undefined8 *)&pOVar3->port = 0;
  (pOVar3->port_string)._M_dataplus._M_p = (pointer)0x0;
  (pOVar3->port_string)._M_string_length = 0;
  (pOVar3->port_string).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pOVar3->port_string).field_2 + 8) = 0;
  *(undefined8 *)&pOVar3->client_socket = 0;
  pOVar3->client_socket_pointer = (int *)0x0;
  (pOVar3->super_Command)._vptr_Command = (_func_int **)&PTR_execute_001147e8;
  (pOVar3->port_string)._M_dataplus._M_p = (pointer)&(pOVar3->port_string).field_2;
  (pOVar3->port_string).field_2._M_local_buf[0] = '\0';
  this->open_data_server_command = pOVar3;
  this_00 = (ConnectCommand *)operator_new(0x30);
  ConnectCommand::ConnectCommand(this_00);
  this->connect_command = this_00;
  this_01 = (AssignVarCommand *)operator_new(0x28);
  AssignVarCommand::AssignVarCommand(this_01);
  this->assign_var_command = this_01;
  pDVar4 = (DefineVarCommand *)operator_new(0x20);
  (pDVar4->super_Command)._vptr_Command = (_func_int **)&PTR_execute_00114a30;
  (pDVar4->type_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar4->type_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar4->type_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->define_var_command = pDVar4;
  return;
}

Assistant:

Interpreter::Interpreter(vector<vector<string>> lexed_data) {
  this->lexed_data_to_interpret = lexed_data;
  this->print_command = new PrintCommand();
  this->sleep_command = new SleepCommand();
  this->open_data_server_command = new OpenDataServerCommand();
  this->connect_command = new ConnectCommand();
  this->assign_var_command = new AssignVarCommand();
  this->define_var_command = new DefineVarCommand();
}